

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O0

bool __thiscall smf::MidiMessage::isTimeSignature(MidiMessage *this)

{
  bool bVar1;
  const_reference pvVar2;
  size_type sVar3;
  MidiMessage *this_local;
  
  bVar1 = isMetaMessage(this);
  if (bVar1) {
    pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,1);
    if (*pvVar2 == 'X') {
      sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>);
      if (sVar3 == 7) {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool MidiMessage::isTimeSignature(void) const {
	if (!isMetaMessage()) {
		return false;
	} else if ((*this)[1] != 0x58) {
		return false;
	} else if (size() != 7) {
		// Meta time signature message can only be 7 bytes long:
		// FF 58 <size> <top> <bot-log-2> <clocks-per-beat> <32nds>
		return false;
	} else {
		return true;
	}
}